

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::last_child(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar3 = (*pcVar1)();
        return sVar3;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return this->m_buf[node].m_last_child;
}

Assistant:

size_t last_child(size_t node) const { return _p(node)->m_last_child; }